

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

String * __thiscall
Rml::Parse::VariableOrFunctionName_abi_cxx11_
          (String *__return_storage_ptr__,Parse *this,DataParser *parser,
          bool *out_valid_function_name)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this[0x40] == (Parse)0x0) {
    bVar1 = *(byte *)(*(long *)this + *(long *)(this + 0x38));
  }
  else {
    bVar1 = 0;
  }
  bVar4 = true;
  do {
    bVar3 = (bVar1 & 0xdf) + 0xbf;
    if (bVar4) {
      if (0x19 < bVar3) goto LAB_0026069b;
    }
    else if ((((0x19 < bVar3) && (bVar1 != 0x2e)) && (bVar1 != 0x5f)) && (9 < (byte)(bVar1 - 0x30)))
    {
LAB_0026069b:
      if (parser != (DataParser *)0x0) {
        lVar2 = ::std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x31c82b);
        *(bool *)&(parser->expression)._M_dataplus._M_p = lVar2 == -1;
      }
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    bVar4 = false;
    bVar1 = DataParser::Next((DataParser *)this);
  } while( true );
}

Assistant:

static String VariableOrFunctionName(DataParser& parser, bool* out_valid_function_name)
	{
		String name;
		bool is_first_character = true;
		char c = parser.Look();

		while (IsVariableCharacter(c, is_first_character))
		{
			name += c;
			c = parser.Next();
			is_first_character = false;
		}

		if (out_valid_function_name)
			*out_valid_function_name = (name.find_first_of(". ") == String::npos);

		return name;
	}